

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_cycle_2.h
# Opt level: O2

void __thiscall PlayerCycle_2::PlayerCycle_2(PlayerCycle_2 *this,string *name)

{
  int iVar1;
  
  Player::Player(&this->super_Player,name);
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c908;
  iVar1 = rand();
  this->m_play = iVar1 % 3;
  iVar1 = rand();
  this->m_up = iVar1 % 2;
  return;
}

Assistant:

PlayerCycle_2(const std::string& name) :
      Player(name),
      m_play(rand()%3),
      m_up(rand()%2)
   {}